

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

UnitySource * __thiscall
cmLocalGenerator::WriteUnitySource
          (UnitySource *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                   sources,cmValue beforeInclude,cmValue afterInclude,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this_00;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  UnitySource *pUVar5;
  Encoding encoding;
  cmGlobalGenerator *pcVar6;
  enable_if_t<__and_v<__not_self<basic_string<char>_>,___not_<__and_<is_scalar<basic_string<char>_>,_is_same<basic_string<char>,_decay_t<basic_string<char>_>_>_>_>,_is_constructible<basic_string<char>,_basic_string<char>_>,_is_assignable<basic_string<char>_&,_basic_string<char>_>_>,_optional<basic_string<char>_>_&>
  poVar7;
  enable_if_t<__and_v<__not_self<basic_string<char>_>,___not_<__and_<is_scalar<basic_string<char>_>,_is_same<basic_string<char>,_decay_t<basic_string<char>_>_>_>_>,_is_constructible<basic_string<char>,_basic_string<char>_>,_is_assignable<basic_string<char>_&,_basic_string<char>_>_>,_optional<basic_string<char>_>_&>
  extraout_RAX;
  string *psVar8;
  ulong uVar9;
  bool bVar10;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  _Var11;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  _Var12;
  char *pcVar13;
  pointer puVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmGeneratedFileStream file;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3b0;
  bool local_390;
  undefined8 local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined8 local_358;
  char *local_350;
  size_type local_348;
  pointer local_340;
  undefined8 local_338;
  char *local_330;
  ulong *local_328;
  undefined8 local_320;
  ulong local_318;
  undefined8 uStack_310;
  string local_308;
  UnitySource *local_2e8;
  UnityBatchedSource *local_2e0;
  UnityBatchedSource *local_2d8;
  cmValue local_2d0;
  cmLocalGenerator *local_2c8;
  pointer local_2c0;
  string local_2b8;
  undefined1 local_298 [616];
  
  _Var12 = sources.End._M_current;
  _Var11 = sources.Begin._M_current;
  local_380 = configs;
  local_2e8 = __return_storage_ptr__;
  local_2c8 = this;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"UNITY_BUILD_UNIQUE_ID","");
  local_2d0 = cmGeneratorTarget::GetProperty(target,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  pcVar6 = cmGeneratorTarget::GetGlobalGenerator(target);
  encoding = (*pcVar6->_vptr_cmGlobalGenerator[5])(pcVar6);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,filename,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"/* generated by CMake */\n\n",0x1a);
  if (_Var11._M_current == _Var12._M_current) {
    bVar10 = false;
  }
  else {
    local_388 = 0;
    local_2e0 = _Var12._M_current;
    do {
      local_390 = false;
      if ((long)((_Var11._M_current)->Configs).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((_Var11._M_current)->Configs).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 !=
          (long)(local_380->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(local_380->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) {
        local_378._M_string_length = 0;
        local_378.field_2._M_allocated_capacity =
             local_378.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        poVar7 = std::optional<std::__cxx11::string>::operator=
                           ((optional<std::__cxx11::string> *)&local_3b0,&local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          poVar7 = extraout_RAX;
        }
        puVar14 = ((_Var11._M_current)->Configs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2c0 = ((_Var11._M_current)->Configs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_388 = CONCAT71((int7)((ulong)poVar7 >> 8),1);
        if (puVar14 != local_2c0) {
          uVar9 = 0;
          pcVar13 = (char *)0x0;
          local_2d8 = _Var11._M_current;
          do {
            uVar4 = local_3b0._M_value._M_string_length;
            uVar3 = local_3b0._M_value._M_dataplus._M_p;
            cmsys::SystemTools::UpperCase
                      (&local_308,
                       (local_380->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *puVar14);
            local_378._M_dataplus._M_p = (pointer)uVar4;
            local_378._M_string_length = uVar3;
            local_358 = 0x1b;
            local_350 = "defined(CMAKE_UNITY_CONFIG_";
            local_348 = local_308._M_string_length;
            local_340 = local_308._M_dataplus._M_p;
            local_338 = 1;
            local_330 = ")";
            views._M_len = 5;
            views._M_array = (iterator)&local_378;
            local_378.field_2._M_allocated_capacity = uVar9;
            local_378.field_2._8_8_ = pcVar13;
            cmCatViews_abi_cxx11_(&local_2b8,views);
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_3b0,&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1
                             );
            }
            puVar14 = puVar14 + 1;
            uVar9 = 4;
            pcVar13 = " || ";
            _Var11._M_current = local_2d8;
            _Var12._M_current = local_2e0;
          } while (puVar14 != local_2c0);
        }
      }
      this_00 = (_Var11._M_current)->Source;
      psVar8 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
      cmGeneratorTarget::AddSourceFileToUnityBatch(target,psVar8);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"UNITY_SOURCE_FILE","");
      cmSourceFile::SetProperty(this_00,&local_378,(cmValue)filename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      psVar8 = cmSourceFile::ResolveFullPath
                         ((_Var11._M_current)->Source,(string *)0x0,(string *)0x0);
      WriteUnitySourceInclude
                (local_2c8,(ostream *)local_298,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,psVar8,beforeInclude,afterInclude,local_2d0);
      if ((local_390 == true) &&
         (local_390 = false,
         local_3b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3b0._M_value + 0x10))) {
        operator_delete((void *)local_3b0._M_value._M_dataplus._M_p,local_3b0._16_8_ + 1);
      }
      _Var11._M_current = _Var11._M_current + 1;
    } while (_Var11._M_current != _Var12._M_current);
    bVar10 = (bool)((byte)local_388 & 1);
  }
  pUVar5 = local_2e8;
  local_328 = (ulong *)(filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328 == paVar1) {
    local_318 = paVar1->_M_allocated_capacity;
    uStack_310 = *(undefined8 *)((long)&filename->field_2 + 8);
    local_328 = &local_318;
  }
  else {
    local_318 = paVar1->_M_allocated_capacity;
  }
  sVar2 = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(local_2e8->Path).field_2;
  (local_2e8->Path)._M_dataplus._M_p = (pointer)paVar1;
  if (local_328 == &local_318) {
    paVar1->_M_allocated_capacity = local_318;
    *(undefined8 *)((long)&(local_2e8->Path).field_2 + 8) = uStack_310;
  }
  else {
    (local_2e8->Path)._M_dataplus._M_p = (pointer)local_328;
    (local_2e8->Path).field_2._M_allocated_capacity = local_318;
  }
  (local_2e8->Path)._M_string_length = sVar2;
  local_320 = 0;
  local_318 = local_318 & 0xffffffffffffff00;
  local_2e8->PerConfig = bVar10;
  local_328 = &local_318;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return pUVar5;
}

Assistant:

cmLocalGenerator::UnitySource cmLocalGenerator::WriteUnitySource(
  cmGeneratorTarget* target, std::vector<std::string> const& configs,
  cmRange<std::vector<UnityBatchedSource>::const_iterator> sources,
  cmValue beforeInclude, cmValue afterInclude, std::string filename) const
{
  cmValue uniqueIdName = target->GetProperty("UNITY_BUILD_UNIQUE_ID");
  cmGeneratedFileStream file(
    filename, false, target->GetGlobalGenerator()->GetMakefileEncoding());
  file.SetCopyIfDifferent(true);
  file << "/* generated by CMake */\n\n";

  bool perConfig = false;
  for (UnityBatchedSource const& ubs : sources) {
    cm::optional<std::string> cond;
    if (ubs.Configs.size() != configs.size()) {
      perConfig = true;
      cond = std::string();
      cm::string_view sep;
      for (size_t ci : ubs.Configs) {
        cond = cmStrCat(*cond, sep, "defined(CMAKE_UNITY_CONFIG_",
                        cmSystemTools::UpperCase(configs[ci]), ")");
        sep = " || "_s;
      }
    }
    RegisterUnitySources(target, ubs.Source, filename);
    WriteUnitySourceInclude(file, cond, ubs.Source->ResolveFullPath(),
                            beforeInclude, afterInclude, uniqueIdName);
  }

  return UnitySource(std::move(filename), perConfig);
}